

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O2

string * __thiscall
RigidBodyDynamics::Utils::GetNamedBodyOriginsOverview_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,Model *model)

{
  ostream *poVar1;
  uint body_id;
  ulong uVar2;
  VectorNd Q;
  string body_name;
  allocator<char> *local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  Vector3d position;
  stringstream result;
  ostream local_1a8 [376];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&body_name,"",(allocator<char> *)&position);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&result,(string *)&body_name,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&body_name);
  body_name._M_dataplus._M_p = (pointer)(ulong)*(uint *)(this + 0x48);
  body_name.field_2._M_allocated_capacity = 0;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)&Q,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&body_name);
  UpdateKinematicsCustom((Model *)this,&Q,(VectorNd *)0x0,(VectorNd *)0x0);
  uVar2 = 0;
  while (body_id = (uint)uVar2,
        uVar2 < (ulong)((*(long *)(this + 0x310) - *(long *)(this + 0x308)) / 0x70)) {
    Model::GetBodyName_abi_cxx11_(&body_name,(Model *)this,body_id);
    if (body_name._M_string_length != 0) {
      local_1e8 = (allocator<char> *)0x0;
      uStack_1e0 = 0;
      local_1d8 = 0;
      CalcBodyToBaseCoordinates(&position,(Model *)this,&Q,body_id,(Vector3d *)&local_1e8,false);
      poVar1 = std::operator<<(local_1a8,(string *)&body_name);
      poVar1 = std::operator<<(poVar1,": ");
      local_1e8 = (allocator<char> *)&position;
      poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                         *)&local_1e8);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::__cxx11::string::~string((string *)&body_name);
    uVar2 = (ulong)(body_id + 1);
  }
  std::__cxx11::stringbuf::str();
  free(Q.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::__cxx11::stringstream::~stringstream((stringstream *)&result);
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI std::string GetNamedBodyOriginsOverview (Model &model) {
	stringstream result ("");

	VectorNd Q (VectorNd::Zero(model.dof_count));
	UpdateKinematicsCustom (model, &Q, NULL, NULL);

	for (unsigned int body_id = 0; body_id < model.mBodies.size(); body_id++) {
		std::string body_name = model.GetBodyName (body_id);

		if (body_name.size() == 0) 
			continue;

		Vector3d position = CalcBodyToBaseCoordinates (model, Q, body_id, Vector3d (0., 0., 0.), false);

		result << body_name << ": " << position.transpose() << endl;
	}

	return result.str();
}